

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O2

Dar_Cut_t * Dar_ObjPrepareCuts(Dar_Man_t *p,Aig_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  Dar_Cut_t *pCuts;
  long lVar4;
  void **ppvVar5;
  uint uVar6;
  uint uVar7;
  
  if ((pObj->field_5).pData != (void *)0x0) {
    __assert_fail("Dar_ObjCuts(pObj) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2a0,"Dar_Cut_t *Dar_ObjPrepareCuts(Dar_Man_t *, Aig_Obj_t *)");
  }
  pObj->field_0x1f = (char)p->pPars->nCutsMax;
  pCuts = (Dar_Cut_t *)Aig_MmFixedEntryFetch(p->pMemCuts);
  memset(pCuts,0,(long)p->pPars->nCutsMax * 0x18);
  Dar_ObjSetCuts(pObj,pCuts);
  lVar4 = (long)(pObj->field_5).pData + 4;
  for (uVar7 = 0; uVar7 < (byte)pObj->field_0x1f; uVar7 = uVar7 + 1) {
    *(byte *)(lVar4 + 3) = *(byte *)(lVar4 + 3) & 0xef;
    lVar4 = lVar4 + 0x18;
  }
  pVVar1 = p->vCutNodes;
  iVar3 = pVVar1->nSize;
  if (iVar3 == pVVar1->nCap) {
    uVar7 = 0x10;
    if (0xf < iVar3) {
      uVar7 = iVar3 * 2;
    }
    if (iVar3 < (int)uVar7) {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar7 << 3);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar1->pArray,(ulong)uVar7 << 3);
        iVar3 = pVVar1->nSize;
      }
      pVVar1->pArray = ppvVar5;
      pVVar1->nCap = uVar7;
    }
  }
  pVVar1->nSize = iVar3 + 1;
  pVVar1->pArray[iVar3] = pObj;
  uVar7 = *(uint *)&pCuts->field_0x4;
  *(uint *)&pCuts->field_0x4 = uVar7 | 0x10000000;
  if (((ulong)pObj & 1) == 0) {
    if ((*(uint *)&pObj->field_0x18 & 7) == 1) {
      uVar7 = uVar7 & 0x1fff0000 | 0x1000ffff;
      uVar6 = 0;
    }
    else {
      *(uint *)&pCuts->field_0x4 = uVar7 & 0x1fffffff | 0x30000000;
      uVar6 = 1 << ((byte)pObj->Id & 0x1f);
      pCuts->pLeaves[0] = pObj->Id;
      uVar7 = uVar7 & 0x1fff0000 | 0x3000aaaa;
    }
    pCuts->uSign = uVar6;
    *(uint *)&pCuts->field_0x4 = uVar7;
    uVar7 = Dar_CutFindValue(p,pCuts);
    *(uint *)&pCuts->field_0x4 = *(uint *)&pCuts->field_0x4 & 0xf800ffff | (uVar7 & 0x7ff) << 0x10;
    iVar3 = p->nCutMemUsed;
    iVar2 = Aig_MmFixedReadMemUsage(p->pMemCuts);
    if (iVar3 < iVar2 / 0x100000) {
      iVar3 = Aig_MmFixedReadMemUsage(p->pMemCuts);
      p->nCutMemUsed = iVar3 / 0x100000;
    }
    return pCuts;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
}

Assistant:

Dar_Cut_t * Dar_ObjPrepareCuts( Dar_Man_t * p, Aig_Obj_t * pObj )
{
    Dar_Cut_t * pCutSet, * pCut;
    int i;
    assert( Dar_ObjCuts(pObj) == NULL );
    pObj->nCuts = p->pPars->nCutsMax;
    // create the cutset of the node
    pCutSet = (Dar_Cut_t *)Aig_MmFixedEntryFetch( p->pMemCuts );
    memset( pCutSet, 0, p->pPars->nCutsMax * sizeof(Dar_Cut_t) );
    Dar_ObjSetCuts( pObj, pCutSet );
    Dar_ObjForEachCutAll( pObj, pCut, i )
        pCut->fUsed = 0;
    Vec_PtrPush( p->vCutNodes, pObj );
    // add unit cut if needed
    pCut = pCutSet;
    pCut->fUsed = 1;
    if ( Aig_ObjIsConst1(pObj) )
    {
        pCut->nLeaves = 0;
        pCut->uSign = 0;
        pCut->uTruth = 0xFFFF;
    }
    else
    {
        pCut->nLeaves = 1;
        pCut->pLeaves[0] = pObj->Id;
        pCut->uSign = Aig_ObjCutSign( pObj->Id );
        pCut->uTruth = 0xAAAA;
    }
    pCut->Value = Dar_CutFindValue( p, pCut );
    if ( p->nCutMemUsed < Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20) )
        p->nCutMemUsed = Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20);
    return pCutSet;
}